

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::AndroidPowerConfig::~AndroidPowerConfig(AndroidPowerConfig *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pAVar3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__AndroidPowerConfig_003a15b0;
  pcVar2 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar1 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pAVar3 = (this->battery_counters_).
           super__Vector_base<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3,(long)(this->battery_counters_).
                                 super__Vector_base<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters,_std::allocator<perfetto::protos::gen::AndroidPowerConfig_BatteryCounters>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar3);
    return;
  }
  return;
}

Assistant:

AndroidPowerConfig::~AndroidPowerConfig() = default;